

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::ConsoleReporter(ConsoleReporter *this,ReporterConfig *config)

{
  TablePrinter *this_00;
  ostream *os;
  anon_class_8_1_50637480 local_48;
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  local_40;
  ReporterConfig *local_18;
  ReporterConfig *config_local;
  ConsoleReporter *this_local;
  
  local_18 = config;
  config_local = (ReporterConfig *)this;
  StreamingReporterBase::StreamingReporterBase(&this->super_StreamingReporterBase,config);
  (this->super_StreamingReporterBase).super_IStreamingReporter._vptr_IStreamingReporter =
       (_func_int **)&PTR__ConsoleReporter_003e75d0;
  this_00 = (TablePrinter *)operator_new(0x38);
  os = ReporterConfig::stream(local_18);
  local_48.config = local_18;
  ConsoleReporter::anon_class_8_1_50637480::operator()(&local_40,&local_48);
  TablePrinter::TablePrinter(this_00,os,&local_40);
  Detail::unique_ptr<Catch::TablePrinter>::unique_ptr(&this->m_tablePrinter,this_00);
  std::
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ::~vector(&local_40);
  this->m_headerPrinted = false;
  return;
}

Assistant:

ConsoleReporter::ConsoleReporter(ReporterConfig const &config)
        : StreamingReporterBase(config),
        m_tablePrinter(new TablePrinter(config.stream(),
            [&config]() -> std::vector<ColumnInfo> {
                if (config.fullConfig()->benchmarkNoAnalysis())
                {
                    return{
                        { "benchmark name", CATCH_CONFIG_CONSOLE_WIDTH - 43, Justification::Left },
                        { "     samples", 14, Justification::Right },
                        { "  iterations", 14, Justification::Right },
                        { "        mean", 14, Justification::Right }
                    };
                }
                else
                {
                    return{
                        { "benchmark name", CATCH_CONFIG_CONSOLE_WIDTH - 43, Justification::Left },
                        { "samples      mean       std dev", 14, Justification::Right },
                        { "iterations   low mean   low std dev", 14, Justification::Right },
                        { "estimated    high mean  high std dev", 14, Justification::Right }
                    };
                }
            }())) {}